

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcondvariable-posix.c
# Opt level: O2

PCondVariable * p_cond_variable_new(void)

{
  int iVar1;
  pthread_cond_t *__cond;
  
  __cond = (pthread_cond_t *)p_malloc0(0x30);
  if (__cond == (pthread_cond_t *)0x0) {
    __cond = (pthread_cond_t *)0x0;
    printf("** Error: %s **\n","PCondVariable::p_cond_variable_new: failed to allocate memory");
  }
  else {
    iVar1 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
    if (iVar1 != 0) {
      printf("** Error: %s **\n","PCondVariable::p_cond_variable_new: failed to initialize");
      p_free(__cond);
      __cond = (pthread_cond_t *)0x0;
    }
  }
  return (PCondVariable *)__cond;
}

Assistant:

P_LIB_API PCondVariable *
p_cond_variable_new (void)
{
	PCondVariable *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PCondVariable))) == NULL)) {
		P_ERROR ("PCondVariable::p_cond_variable_new: failed to allocate memory");
		return NULL;
	}

	if (P_UNLIKELY (pthread_cond_init (&ret->hdl, NULL) != 0)) {
		P_ERROR ("PCondVariable::p_cond_variable_new: failed to initialize");
		p_free (ret);
		return NULL;
	}

	return ret;
}